

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

bool __thiscall DefaultNavigationKeys::Prev(DefaultNavigationKeys *this,string *key)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (**(code **)((long)*this + 0xb0))(&local_30,this);
  _Var1 = std::operator==(&local_30,key);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

virtual bool Prev(const std::string& key) override { return Prev() == key; }